

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int ARGBColorMatrix(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,
                   int8_t *matrix_argb,int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = -1;
  if (height != 0 &&
      ((0 < width && matrix_argb != (int8_t *)0x0) &&
      (dst_argb != (uint8_t *)0x0 && src_argb != (uint8_t *)0x0))) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_argb = src_argb + ~height * src_stride_argb;
      src_stride_argb = -src_stride_argb;
    }
    if (width * 4 == dst_stride_argb && src_stride_argb == width * 4) {
      width = iVar1 * width;
      src_stride_argb = 0;
      dst_stride_argb = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    pcVar3 = ARGBColorMatrixRow_C;
    if ((width & 7U) == 0) {
      pcVar3 = ARGBColorMatrixRow_SSSE3;
    }
    pcVar4 = ARGBColorMatrixRow_C;
    if ((uVar2 & 0x40) != 0) {
      pcVar4 = pcVar3;
    }
    do {
      (*pcVar4)(src_argb,dst_argb,matrix_argb,width);
      src_argb = src_argb + src_stride_argb;
      dst_argb = dst_argb + dst_stride_argb;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBColorMatrix(const uint8_t* src_argb,
                    int src_stride_argb,
                    uint8_t* dst_argb,
                    int dst_stride_argb,
                    const int8_t* matrix_argb,
                    int width,
                    int height) {
  int y;
  void (*ARGBColorMatrixRow)(const uint8_t* src_argb, uint8_t* dst_argb,
                             const int8_t* matrix_argb, int width) =
      ARGBColorMatrixRow_C;
  if (!src_argb || !dst_argb || !matrix_argb || width <= 0 || height == 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBCOLORMATRIXROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBCOLORMATRIXROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_NEON;
  }
#endif
#if defined(HAS_ARGBCOLORMATRIXROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_MMI;
  }
#endif
#if defined(HAS_ARGBCOLORMATRIXROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_MSA;
  }
#endif
  for (y = 0; y < height; ++y) {
    ARGBColorMatrixRow(src_argb, dst_argb, matrix_argb, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}